

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

TString * luaS_new(lua_State *L,char *str)

{
  int iVar1;
  TString *(*papTVar2) [2];
  size_t l;
  TString *pTVar3;
  TString **p;
  int j;
  uint i;
  char *str_local;
  lua_State *L_local;
  
  papTVar2 = L->l_G->strcache + ((ulong)str & 0xffffffff) % 0x35;
  p._0_4_ = 0;
  while( true ) {
    if (1 < (int)p) {
      for (p._0_4_ = 1; 0 < (int)p; p._0_4_ = (int)p + -1) {
        (*papTVar2)[(int)p] = (*papTVar2)[(int)p + -1];
      }
      l = strlen(str);
      pTVar3 = luaS_newlstr(L,str,l);
      (*papTVar2)[0] = pTVar3;
      return (*papTVar2)[0];
    }
    iVar1 = strcmp(str,(char *)((*papTVar2)[(int)p] + 1));
    if (iVar1 == 0) break;
    p._0_4_ = (int)p + 1;
  }
  return (*papTVar2)[(int)p];
}

Assistant:

TString *luaS_new(lua_State *L, const char *str) {
    unsigned int i = point2uint(str) % STRCACHE_N;  /* hash */
    int j;
    TString **p = G(L)->strcache[i];
    for (j = 0; j < STRCACHE_M; j++) {
        if (strcmp(str, getstr(p[j])) == 0)  /* hit? */
            return p[j];  /* that is it */
    }
    /* normal route */
    for (j = STRCACHE_M - 1; j > 0; j--)
        p[j] = p[j - 1];  /* move out last element */
    /* new element is first in the list */
    p[0] = luaS_newlstr(L, str, strlen(str));
    return p[0];
}